

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cn cn)

{
  Syntax SVar1;
  char *pcVar2;
  UInt u;
  char *pcVar3;
  
  SVar1 = this->style->syntax;
  u.raw._2_2_ = 0;
  u.raw._0_2_ = cn.raw;
  if (cn.raw < 8 || (cn.raw & 0xfff8) == 0x800) {
    if ((SVar1 | GNU) == GNU_MIT) {
      pcVar3 = this->ptr;
      this->ptr = pcVar3 + 1;
      *pcVar3 = '%';
    }
    switch(cn.raw) {
    case 0:
      pcVar2 = "SFC";
      pcVar3 = "sfc";
      break;
    case 1:
      pcVar2 = "DFC";
      pcVar3 = "dfc";
      break;
    case 2:
      pcVar2 = "CACR";
      pcVar3 = "cacr";
      break;
    case 3:
      pcVar2 = "TC";
      pcVar3 = "tc";
      break;
    case 4:
      pcVar2 = "ITT0";
      pcVar3 = "itt0";
      break;
    case 5:
      pcVar2 = "ITT1";
      pcVar3 = "itt1";
      break;
    case 6:
      pcVar2 = "DTT0";
      pcVar3 = "dtt0";
      break;
    case 7:
      pcVar2 = "DTT1";
      pcVar3 = "dtt1";
      break;
    case 8:
      pcVar2 = "BUSCR";
      pcVar3 = "buscr";
      break;
    default:
      switch(u.raw) {
      case 0x800:
        pcVar2 = "USP";
        pcVar3 = "usp";
        break;
      case 0x801:
        pcVar2 = "VBR";
        pcVar3 = "vbr";
        break;
      case 0x802:
        pcVar2 = "CAAR";
        pcVar3 = "caar";
        break;
      case 0x803:
        pcVar2 = "MSP";
        pcVar3 = "msp";
        break;
      case 0x804:
        pcVar2 = "ISP";
        pcVar3 = "isp";
        break;
      case 0x805:
        pcVar2 = "MMUSR";
        pcVar3 = "mmusr";
        break;
      case 0x806:
        pcVar2 = "URP";
        pcVar3 = "urp";
        break;
      case 0x807:
        pcVar2 = "SRP";
        pcVar3 = "srp";
        break;
      default:
        goto switchD_001303e3_default;
      }
    }
    if (SVar1 - MUSASHI < 0xfffffffe) {
      pcVar3 = pcVar2;
    }
  }
  else {
    if (SVar1 - GNU < 3) {
      operator<<(this,u);
      return this;
    }
    pcVar3 = "INVALID";
  }
  operator<<(this,pcVar3);
switchD_001303e3_default:
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cn cn)
{
    bool valid = cn.raw <= 0x007 || (cn.raw >= 0x800 && cn.raw <= 0x807);
    bool upper = style.syntax != Syntax::GNU && style.syntax != Syntax::GNU_MIT;

    if (valid) {

        if (style.syntax == Syntax::GNU_MIT || style.syntax == Syntax::MOIRA_MIT) {
            *ptr++ = '%';
        }

        switch (cn.raw) {

            case 0x000: *this << (upper ? "SFC"   : "sfc");   break;
            case 0x001: *this << (upper ? "DFC"   : "dfc");   break;
            case 0x002: *this << (upper ? "CACR"  : "cacr");  break;
            case 0x003: *this << (upper ? "TC"    : "tc");    break;
            case 0x004: *this << (upper ? "ITT0"  : "itt0");  break;
            case 0x005: *this << (upper ? "ITT1"  : "itt1");  break;
            case 0x006: *this << (upper ? "DTT0"  : "dtt0");  break;
            case 0x007: *this << (upper ? "DTT1"  : "dtt1");  break;
            case 0x008: *this << (upper ? "BUSCR" : "buscr"); break;
            case 0x800: *this << (upper ? "USP"   : "usp");   break;
            case 0x801: *this << (upper ? "VBR"   : "vbr");   break;
            case 0x802: *this << (upper ? "CAAR"  : "caar");  break;
            case 0x803: *this << (upper ? "MSP"   : "msp");   break;
            case 0x804: *this << (upper ? "ISP"   : "isp");   break;
            case 0x805: *this << (upper ? "MMUSR" : "mmusr"); break;
            case 0x806: *this << (upper ? "URP"   : "urp");   break;
            case 0x807: *this << (upper ? "SRP"   : "srp");   break;
            case 0x808: *this << (upper ? "PCR"   : "pcr");   break;
        }

    } else {

        if (style.syntax == Syntax::MUSASHI || style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << UInt(cn.raw);
        } else {
            *this << "INVALID";
        }
    }

    return *this;
}